

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

long jsteemann::atoi_positive<long>(char *p,char *e,bool *valid)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  
  if (p == e) {
    bVar2 = false;
    lVar1 = 0;
  }
  else {
    lVar1 = 0;
    do {
      if ((byte)(*p - 0x3aU) < 0xf6) {
LAB_001286ae:
        bVar2 = false;
        goto LAB_001286ab;
      }
      bVar3 = *p - 0x30;
      if ((0xccccccccccccccc < lVar1) || (lVar1 == 0xccccccccccccccc && 7 < bVar3))
      goto LAB_001286ae;
      lVar1 = (ulong)bVar3 + lVar1 * 10;
      p = p + 1;
    } while (p < e);
    bVar2 = true;
  }
LAB_001286ab:
  *valid = bVar2;
  return lVar1;
}

Assistant:

inline T atoi_positive(char const* p, char const* e, bool& valid) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    valid = false;
    return T();
  }

  constexpr T cutoff = (std::numeric_limits<T>::max)() / 10;
  constexpr char cutlim = (std::numeric_limits<T>::max)() % 10;
  T result = 0;

  do {
    char c = *p;

    // we expect only '0' to '9'. everything else is unexpected
    if (ATOI_UNLIKELY(c < '0' || c > '9')) {
      valid = false;
      return result;
    }

    c -= '0';
    // we expect the bulk of values to not hit the bounds restrictions
    if (ATOI_UNLIKELY(result > cutoff || (result == cutoff && c > cutlim))) {
      valid = false;
      return result;
    } 
    result *= 10;
    result += c;
  } while (++p < e);

  valid = true;
  return result;
}